

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::Expect(Parser *this,int t)

{
  uint in_EDX;
  CheckedError *ce;
  undefined4 in_register_00000034;
  Parser *this_00;
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  this_00 = (Parser *)CONCAT44(in_register_00000034,t);
  if ((this_00->super_ParserState).token_ == in_EDX) {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
  }
  else {
    (anonymous_namespace)::TokenToString_abi_cxx11_
              (&local_38,(_anonymous_namespace_ *)(ulong)in_EDX,in_EDX);
    std::operator+(&local_98,"expecting: ",&local_38);
    std::operator+(&local_78,&local_98," instead got: ");
    TokenToStringId_abi_cxx11_(&sStack_b8,this_00,(this_00->super_ParserState).token_);
    std::operator+(&local_58,&local_78,&sStack_b8);
    Error(this,(string *)this_00);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&sStack_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::Expect(int t) {
  if (t != token_) {
    return Error("expecting: " + TokenToString(t) +
                 " instead got: " + TokenToStringId(token_));
  }
  NEXT();
  return NoError();
}